

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

void cleanup_shape(void)

{
  player_blow *p;
  player_shape *ppVar1;
  player_blow *ppVar2;
  player_shape *p_00;
  
  p_00 = shapes;
  if (shapes != (player_shape *)0x0) {
    do {
      p = p_00->blows;
      ppVar1 = p_00->next;
      string_free(p_00->name);
      free_effect(p_00->effect);
      if (p_00->breath_name != (char *)0x0) {
        string_free(p_00->breath_name);
      }
      while (p != (player_blow *)0x0) {
        ppVar2 = p->next;
        string_free(p->name);
        mem_free(p);
        p = ppVar2;
      }
      mem_free(p_00);
      p_00 = ppVar1;
    } while (ppVar1 != (player_shape *)0x0);
  }
  return;
}

Assistant:

static void cleanup_shape(void)
{
	struct player_shape *shape = shapes;
	struct player_shape *next;

	while (shape) {
		struct player_blow *blow = shape->blows;
		next = shape->next;
		string_free((char *)shape->name);
		free_effect(shape->effect);
		if (shape->breath_name) {
			string_free((char *)shape->breath_name);
		}
		while (blow) {
			struct player_blow *next_blow = blow->next;
			string_free(blow->name);
			mem_free(blow);
			blow = next_blow;
		}
		mem_free(shape);
		shape = next;
	}
}